

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slice_x86.cpp
# Opt level: O3

int __thiscall
ncnn::Slice_x86::forward
          (Slice_x86 *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  uint uVar1;
  int _elempack;
  uint uVar2;
  Mat *src;
  ulong _elemsize;
  size_t sVar3;
  size_t sVar4;
  byte bVar5;
  ulong uVar6;
  ulong uVar7;
  pointer pMVar8;
  pointer pMVar9;
  int iVar10;
  long lVar11;
  ulong uVar12;
  undefined4 *puVar13;
  pointer pMVar14;
  int iVar15;
  undefined4 *puVar16;
  long lVar17;
  undefined4 *puVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  undefined4 *puVar22;
  int iVar23;
  int iVar24;
  long lVar25;
  undefined4 *puVar26;
  ulong uVar27;
  void *pvVar28;
  int *piVar29;
  long lVar30;
  bool bVar31;
  bool local_e1;
  Mat local_80;
  long local_38;
  
  src = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
        super__Vector_impl_data._M_start;
  uVar1 = src->dims;
  _elemsize = src->elemsize;
  _elempack = src->elempack;
  uVar6 = (ulong)_elempack;
  lVar17 = *(long *)(&this->field_0xd0 + (long)this->_vptr_Slice_x86[-3]);
  iVar10 = (*(int *)(&this->field_0x118 + (long)this->_vptr_Slice_x86[-3]) >> 0x1f & uVar1) +
           *(int *)(&this->field_0x118 + (long)this->_vptr_Slice_x86[-3]);
  if (uVar1 == 1) {
    pMVar8 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    lVar11 = (long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                   super__Vector_impl_data._M_finish - (long)pMVar8;
    if (lVar11 == 0) {
      bVar31 = false;
      goto LAB_0020e5ab;
    }
    iVar24 = src->w;
    uVar12 = (lVar11 >> 3) * -0x71c71c71c71c71c7;
    lVar11 = 0;
    lVar25 = 0;
    iVar15 = 0;
    uVar27 = 0;
    do {
      uVar2 = *(uint *)(lVar17 + uVar27 * 4);
      uVar7 = (ulong)uVar2;
      if (uVar2 == 0xffffff17) {
        uVar7 = (ulong)(long)(iVar24 * _elempack - iVar15) / (uVar12 + lVar25);
      }
      bVar5 = (uVar7 & 3) == 0 & opt->use_packing_layout;
      iVar21 = (uint)bVar5 + (uint)bVar5 * 2 + 1;
      Mat::create((Mat *)((long)&pMVar8->data + lVar11),
                  (int)((long)((ulong)(uint)((int)uVar7 >> 0x1f) << 0x20 | uVar7 & 0xffffffff) /
                       (long)iVar21),_elemsize / uVar6 << bVar5 * '\x02',iVar21,opt->blob_allocator)
      ;
      pvVar28 = *(void **)((long)&pMVar8->data + lVar11);
      if (pvVar28 == (void *)0x0) {
        return -100;
      }
      if ((long)*(int *)((long)&pMVar8->c + lVar11) * *(long *)((long)&pMVar8->cstep + lVar11) == 0)
      {
        return -100;
      }
      memcpy(pvVar28,(void *)((long)iVar15 * 4 + (long)src->data),
             (long)*(int *)((long)&pMVar8->w + lVar11) * *(long *)((long)&pMVar8->elemsize + lVar11)
            );
      iVar15 = iVar15 + (int)uVar7;
      uVar27 = uVar27 + 1;
      pMVar8 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
               super__Vector_impl_data._M_start;
      uVar12 = ((long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                      .super__Vector_impl_data._M_finish - (long)pMVar8 >> 3) * -0x71c71c71c71c71c7;
      lVar25 = lVar25 + -1;
      lVar11 = lVar11 + 0x48;
    } while (uVar27 < uVar12);
  }
  bVar31 = uVar1 == 2;
  if ((bVar31) && (iVar10 == 0)) {
    pMVar8 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pMVar9 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    uVar12 = ((long)pMVar9 - (long)pMVar8 >> 3) * -0x71c71c71c71c71c7;
    iVar24 = src->w;
    if (pMVar9 != pMVar8) {
      iVar15 = src->h;
      lVar25 = 0;
      lVar11 = 0;
      iVar21 = 0;
      uVar27 = 0;
      do {
        uVar2 = *(uint *)(lVar17 + uVar27 * 4);
        uVar7 = (ulong)uVar2;
        if (uVar2 == 0xffffff17) {
          uVar7 = (ulong)(long)(iVar15 * _elempack - iVar21) / (uVar12 + lVar11);
        }
        bVar5 = (uVar7 & 3) == 0 & opt->use_packing_layout;
        iVar19 = (uint)bVar5 + (uint)bVar5 * 2 + 1;
        Mat::create((Mat *)((long)&pMVar8->data + lVar25),iVar24,
                    (int)((long)((ulong)(uint)((int)uVar7 >> 0x1f) << 0x20 | uVar7 & 0xffffffff) /
                         (long)iVar19),_elemsize / uVar6 << bVar5 * '\x02',iVar19,
                    opt->blob_allocator);
        if (*(long *)((long)&pMVar8->data + lVar25) == 0) {
          return -100;
        }
        if ((long)*(int *)((long)&pMVar8->c + lVar25) * *(long *)((long)&pMVar8->cstep + lVar25) ==
            0) {
          return -100;
        }
        iVar21 = iVar21 + (int)uVar7;
        uVar27 = uVar27 + 1;
        pMVar8 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        pMVar9 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
        uVar12 = ((long)pMVar9 - (long)pMVar8 >> 3) * -0x71c71c71c71c71c7;
        lVar11 = lVar11 + -1;
        lVar25 = lVar25 + 0x48;
      } while (uVar27 < uVar12);
    }
    iVar15 = pMVar8->elempack;
    if (pMVar9 != pMVar8) {
      lVar11 = uVar12 + (uVar12 == 0);
      piVar29 = &pMVar8->elempack;
      do {
        if (*piVar29 < iVar15) {
          iVar15 = *piVar29;
        }
        piVar29 = piVar29 + 0x12;
        lVar11 = lVar11 + -1;
      } while (lVar11 != 0);
    }
    local_80.data = src->data;
    local_80.refcount = src->refcount;
    local_80.elemsize = src->elemsize;
    local_80.elempack = src->elempack;
    local_80.allocator = src->allocator;
    local_80.dims = src->dims;
    local_80.w = src->w;
    local_80.h = src->h;
    local_80.d = src->d;
    local_80.c = src->c;
    local_80.cstep = src->cstep;
    if (local_80.refcount != (int *)0x0) {
      LOCK();
      *local_80.refcount = *local_80.refcount + 1;
      UNLOCK();
    }
    if (iVar15 < _elempack) {
      convert_packing(src,&local_80,iVar15,opt);
    }
    pMVar8 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pMVar9 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    if (pMVar9 != pMVar8) {
      lVar11 = (long)iVar24;
      local_38 = lVar11 * 4;
      uVar12 = 0;
      puVar13 = (undefined4 *)local_80.data;
      do {
        pMVar14 = pMVar8 + uVar12;
        iVar21 = pMVar14->elempack;
        if (((iVar15 == 1) && (iVar21 == 4)) && (iVar19 = pMVar14->h, 0 < (long)iVar19)) {
          pvVar28 = pMVar14->data;
          iVar20 = pMVar14->w;
          sVar3 = pMVar14->elemsize;
          lVar25 = 0;
          do {
            if (0 < iVar24) {
              puVar22 = (undefined4 *)((long)iVar20 * sVar3 * lVar25 + (long)pvVar28);
              puVar18 = puVar13;
              iVar23 = iVar24;
              do {
                *puVar22 = *puVar18;
                puVar22[1] = puVar18[lVar11];
                puVar22[2] = puVar18[iVar24 * 2];
                puVar26 = puVar18 + iVar24 * 3;
                puVar18 = puVar18 + 1;
                puVar22[3] = *puVar26;
                puVar22 = puVar22 + 4;
                iVar23 = iVar23 + -1;
              } while (iVar23 != 0);
            }
            puVar13 = puVar13 + local_38;
            lVar25 = lVar25 + 1;
          } while (lVar25 != iVar19);
        }
        if (iVar15 == iVar21) {
          lVar25 = pMVar14->h * lVar11;
          memcpy(pMVar14->data,puVar13,pMVar14->elemsize * lVar25);
          puVar13 = puVar13 + (long)(int)lVar25 * (long)pMVar14->elempack;
          pMVar8 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          pMVar9 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                   super__Vector_impl_data._M_finish;
        }
        uVar12 = uVar12 + 1;
      } while (uVar12 < (ulong)(((long)pMVar9 - (long)pMVar8 >> 3) * -0x71c71c71c71c71c7));
    }
    if (local_80.refcount != (int *)0x0) {
      LOCK();
      *local_80.refcount = *local_80.refcount + -1;
      UNLOCK();
      if (*local_80.refcount == 0) {
        if (local_80.allocator == (Allocator *)0x0) {
          if ((undefined4 *)local_80.data != (undefined4 *)0x0) {
            free(local_80.data);
          }
        }
        else {
          (*(local_80.allocator)->_vptr_Allocator[3])();
        }
      }
    }
  }
LAB_0020e5ab:
  local_e1 = iVar10 == 0;
  if ((bVar31) && (iVar10 == 1)) {
    uVar2 = src->h;
    pMVar9 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pMVar8 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    if ((long)pMVar8 - (long)pMVar9 != 0) {
      iVar24 = src->w;
      uVar12 = ((long)pMVar8 - (long)pMVar9 >> 3) * -0x71c71c71c71c71c7;
      lVar25 = 0;
      lVar11 = 0;
      iVar15 = 0;
      uVar27 = 0;
      do {
        iVar21 = *(int *)(lVar17 + uVar27 * 4);
        if (iVar21 == -0xe9) {
          iVar21 = (int)((ulong)((long)iVar24 - (long)iVar15) / (uVar12 + lVar11));
        }
        Mat::create((Mat *)((long)&pMVar9->data + lVar25),iVar21,uVar2,_elemsize,_elempack,
                    opt->blob_allocator);
        if (*(long *)((long)&pMVar9->data + lVar25) == 0) {
          return -100;
        }
        if ((long)*(int *)((long)&pMVar9->c + lVar25) * *(long *)((long)&pMVar9->cstep + lVar25) ==
            0) {
          return -100;
        }
        iVar15 = iVar15 + iVar21;
        uVar27 = uVar27 + 1;
        pMVar9 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        pMVar8 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
        uVar12 = ((long)pMVar8 - (long)pMVar9 >> 3) * -0x71c71c71c71c71c7;
        lVar11 = lVar11 + -1;
        lVar25 = lVar25 + 0x48;
      } while (uVar27 < uVar12);
    }
    if (0 < (int)uVar2) {
      uVar12 = 0;
      do {
        bVar31 = pMVar8 != pMVar9;
        pMVar8 = pMVar9;
        if (bVar31) {
          pvVar28 = (void *)((long)src->w * uVar12 * src->elemsize + (long)src->data);
          lVar11 = 0x2c;
          uVar27 = 0;
          do {
            lVar25 = (long)*(int *)((long)&pMVar9->data + lVar11);
            memcpy((void *)(uVar12 * lVar25 * *(long *)((long)pMVar9 + lVar11 + -0x1c) +
                           *(long *)((long)pMVar9 + lVar11 + -0x2c)),pvVar28,lVar25 * _elemsize);
            pvVar28 = (void *)((long)pvVar28 +
                              (long)*(int *)((long)&pMVar9->data + lVar11) * uVar6 * 4);
            uVar27 = uVar27 + 1;
            pMVar9 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                     super__Vector_impl_data._M_start;
            pMVar8 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                     super__Vector_impl_data._M_finish;
            lVar11 = lVar11 + 0x48;
          } while (uVar27 < (ulong)(((long)pMVar8 - (long)pMVar9 >> 3) * -0x71c71c71c71c71c7));
        }
        uVar12 = uVar12 + 1;
      } while (uVar12 != uVar2);
    }
  }
  if (uVar1 == 3 && local_e1) {
    pMVar8 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pMVar9 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    uVar12 = ((long)pMVar9 - (long)pMVar8 >> 3) * -0x71c71c71c71c71c7;
    if (pMVar9 != pMVar8) {
      iVar24 = src->c;
      iVar15 = src->w;
      iVar21 = src->h;
      lVar25 = 0;
      lVar11 = 0;
      uVar27 = 0;
      iVar19 = 0;
      do {
        uVar2 = *(uint *)(lVar17 + uVar27 * 4);
        uVar7 = (ulong)uVar2;
        if (uVar2 == 0xffffff17) {
          uVar7 = (ulong)(long)(iVar24 * _elempack - iVar19) / (uVar12 + lVar11);
        }
        bVar5 = (uVar7 & 3) == 0 & opt->use_packing_layout;
        iVar20 = (uint)bVar5 + (uint)bVar5 * 2 + 1;
        Mat::create((Mat *)((long)&pMVar8->data + lVar25),iVar15,iVar21,
                    (int)((long)((ulong)(uint)((int)uVar7 >> 0x1f) << 0x20 | uVar7 & 0xffffffff) /
                         (long)iVar20),_elemsize / uVar6 << bVar5 * '\x02',iVar20,
                    opt->blob_allocator);
        if (*(long *)((long)&pMVar8->data + lVar25) == 0) {
          return -100;
        }
        if ((long)*(int *)((long)&pMVar8->c + lVar25) * *(long *)((long)&pMVar8->cstep + lVar25) ==
            0) {
          return -100;
        }
        iVar19 = iVar19 + (int)uVar7;
        uVar27 = uVar27 + 1;
        pMVar8 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        pMVar9 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
        uVar12 = ((long)pMVar9 - (long)pMVar8 >> 3) * -0x71c71c71c71c71c7;
        lVar11 = lVar11 + -1;
        lVar25 = lVar25 + 0x48;
      } while (uVar27 < uVar12);
    }
    iVar24 = pMVar8->elempack;
    if (pMVar9 != pMVar8) {
      lVar11 = uVar12 + (uVar12 == 0);
      piVar29 = &pMVar8->elempack;
      do {
        if (*piVar29 < iVar24) {
          iVar24 = *piVar29;
        }
        piVar29 = piVar29 + 0x12;
        lVar11 = lVar11 + -1;
      } while (lVar11 != 0);
    }
    local_80.data = src->data;
    local_80.refcount = src->refcount;
    local_80.elemsize = src->elemsize;
    local_80.elempack = src->elempack;
    local_80.allocator = src->allocator;
    local_80.dims = src->dims;
    local_80.w = src->w;
    local_80.h = src->h;
    local_80.d = src->d;
    local_80.c = src->c;
    local_80.cstep = src->cstep;
    if (local_80.refcount != (int *)0x0) {
      LOCK();
      *local_80.refcount = *local_80.refcount + 1;
      UNLOCK();
    }
    if (iVar24 < _elempack) {
      convert_packing(src,&local_80,iVar24,opt);
    }
    pMVar8 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pMVar9 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    if (pMVar9 != pMVar8) {
      uVar27 = 0;
      uVar12 = 0;
      do {
        pMVar14 = pMVar8 + uVar27;
        iVar15 = pMVar14->elempack;
        if ((iVar24 == 1) && (iVar15 == 4)) {
          iVar15 = pMVar14->c;
          if ((long)iVar15 < 1) {
            iVar15 = 4;
          }
          else {
            iVar21 = pMVar14->h * pMVar14->w;
            pvVar28 = pMVar14->data;
            sVar3 = pMVar14->cstep;
            sVar4 = pMVar14->elemsize;
            uVar12 = (ulong)(int)uVar12;
            lVar25 = local_80.cstep * local_80.elemsize;
            puVar22 = (undefined4 *)((uVar12 + 3) * lVar25 + (long)local_80.data);
            puVar26 = (undefined4 *)((uVar12 + 2) * lVar25 + (long)local_80.data);
            puVar13 = (undefined4 *)((uVar12 + 1) * lVar25 + (long)local_80.data);
            puVar18 = (undefined4 *)(lVar25 * uVar12 + (long)local_80.data);
            lVar11 = 0;
            do {
              if (0 < iVar21) {
                puVar16 = (undefined4 *)(sVar3 * sVar4 * lVar11 + (long)pvVar28);
                lVar30 = 0;
                do {
                  *puVar16 = puVar18[lVar30];
                  puVar16[1] = puVar13[lVar30];
                  puVar16[2] = puVar26[lVar30];
                  puVar16[3] = puVar22[lVar30];
                  puVar16 = puVar16 + 4;
                  lVar30 = lVar30 + 1;
                } while (iVar21 != (int)lVar30);
              }
              uVar12 = uVar12 + 4;
              lVar11 = lVar11 + 1;
              puVar22 = puVar22 + lVar25;
              puVar26 = puVar26 + lVar25;
              puVar13 = puVar13 + lVar25;
              puVar18 = puVar18 + lVar25;
            } while (lVar11 != iVar15);
            iVar15 = pMVar14->elempack;
          }
        }
        if (iVar24 == iVar15) {
          memcpy(pMVar14->data,
                 (undefined4 *)
                 (local_80.cstep * (long)(int)uVar12 * local_80.elemsize + (long)local_80.data),
                 (long)((int)pMVar14->cstep * pMVar14->c) * pMVar14->elemsize);
          uVar12 = (ulong)(uint)((int)uVar12 + pMVar14->c);
          pMVar8 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          pMVar9 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                   super__Vector_impl_data._M_finish;
        }
        uVar27 = uVar27 + 1;
      } while (uVar27 < (ulong)(((long)pMVar9 - (long)pMVar8 >> 3) * -0x71c71c71c71c71c7));
    }
    if (local_80.refcount != (int *)0x0) {
      LOCK();
      *local_80.refcount = *local_80.refcount + -1;
      UNLOCK();
      if (*local_80.refcount == 0) {
        if (local_80.allocator == (Allocator *)0x0) {
          if ((undefined4 *)local_80.data != (undefined4 *)0x0) {
            free(local_80.data);
          }
        }
        else {
          (*(local_80.allocator)->_vptr_Allocator[3])();
        }
      }
    }
  }
  if ((uVar1 == 3) && (iVar10 == 1)) {
    uVar2 = src->c;
    pMVar9 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pMVar8 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    if ((long)pMVar8 - (long)pMVar9 != 0) {
      iVar24 = src->w;
      iVar15 = src->h;
      uVar12 = ((long)pMVar8 - (long)pMVar9 >> 3) * -0x71c71c71c71c71c7;
      lVar25 = 0;
      lVar11 = 0;
      uVar27 = 0;
      iVar21 = 0;
      do {
        iVar19 = *(int *)(lVar17 + uVar27 * 4);
        if (iVar19 == -0xe9) {
          iVar19 = (int)((ulong)((long)iVar15 - (long)iVar21) / (uVar12 + lVar11));
        }
        Mat::create((Mat *)((long)&pMVar9->data + lVar25),iVar24,iVar19,uVar2,_elemsize,_elempack,
                    opt->blob_allocator);
        if (*(long *)((long)&pMVar9->data + lVar25) == 0) {
          return -100;
        }
        if ((long)*(int *)((long)&pMVar9->c + lVar25) * *(long *)((long)&pMVar9->cstep + lVar25) ==
            0) {
          return -100;
        }
        iVar21 = iVar21 + iVar19;
        uVar27 = uVar27 + 1;
        pMVar9 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        pMVar8 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
        uVar12 = ((long)pMVar8 - (long)pMVar9 >> 3) * -0x71c71c71c71c71c7;
        lVar11 = lVar11 + -1;
        lVar25 = lVar25 + 0x48;
      } while (uVar27 < uVar12);
    }
    if (0 < (int)uVar2) {
      uVar12 = 0;
      do {
        pMVar14 = pMVar9;
        if (pMVar8 != pMVar9) {
          pvVar28 = (void *)(src->cstep * uVar12 * src->elemsize + (long)src->data);
          lVar11 = 0x40;
          uVar27 = 0;
          do {
            lVar25 = (long)*(int *)((long)pMVar14 + lVar11 + -0x10) *
                     (long)*(int *)((long)pMVar14 + lVar11 + -0x14);
            memcpy((void *)(*(long *)((long)&pMVar14->data + lVar11) * uVar12 *
                            *(long *)((long)pMVar14 + lVar11 + -0x30) +
                           *(long *)((long)pMVar14 + lVar11 + -0x40)),pvVar28,lVar25 * _elemsize);
            pvVar28 = (void *)((long)pvVar28 + (long)((int)lVar25 * _elempack) * 4);
            uVar27 = uVar27 + 1;
            pMVar14 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                      .super__Vector_impl_data._M_start;
            pMVar9 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                     super__Vector_impl_data._M_finish;
            lVar11 = lVar11 + 0x48;
          } while (uVar27 < (ulong)(((long)pMVar9 - (long)pMVar14 >> 3) * -0x71c71c71c71c71c7));
        }
        uVar12 = uVar12 + 1;
        pMVar8 = pMVar9;
        pMVar9 = pMVar14;
      } while (uVar12 != uVar2);
    }
  }
  if ((uVar1 == 3) && (iVar10 == 2)) {
    uVar1 = src->h;
    uVar2 = src->c;
    pMVar8 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pMVar9 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    if ((long)pMVar9 - (long)pMVar8 != 0) {
      iVar10 = src->w;
      uVar12 = ((long)pMVar9 - (long)pMVar8 >> 3) * -0x71c71c71c71c71c7;
      lVar25 = 0;
      lVar11 = 0;
      uVar27 = 0;
      iVar24 = 0;
      do {
        iVar15 = *(int *)(lVar17 + uVar27 * 4);
        if (iVar15 == -0xe9) {
          iVar15 = (int)((ulong)((long)iVar10 - (long)iVar24) / (uVar12 + lVar11));
        }
        Mat::create((Mat *)((long)&pMVar8->data + lVar25),iVar15,uVar1,uVar2,_elemsize,_elempack,
                    opt->blob_allocator);
        if (*(long *)((long)&pMVar8->data + lVar25) == 0) {
          return -100;
        }
        if ((long)*(int *)((long)&pMVar8->c + lVar25) * *(long *)((long)&pMVar8->cstep + lVar25) ==
            0) {
          return -100;
        }
        iVar24 = iVar24 + iVar15;
        uVar27 = uVar27 + 1;
        pMVar8 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        pMVar9 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
        uVar12 = ((long)pMVar9 - (long)pMVar8 >> 3) * -0x71c71c71c71c71c7;
        lVar11 = lVar11 + -1;
        lVar25 = lVar25 + 0x48;
      } while (uVar27 < uVar12);
    }
    if (0 < (int)uVar2) {
      uVar12 = 0;
      do {
        if (0 < (int)uVar1) {
          pvVar28 = (void *)(src->cstep * uVar12 * src->elemsize + (long)src->data);
          uVar27 = 0;
          pMVar14 = pMVar9;
          do {
            pMVar9 = pMVar8;
            pMVar8 = pMVar9;
            if (pMVar14 != pMVar9) {
              lVar17 = 0x40;
              uVar7 = 0;
              do {
                lVar25 = (long)*(int *)((long)pMVar8 + lVar17 + -0x14);
                lVar11 = *(long *)((long)pMVar8 + lVar17 + -0x30);
                memcpy((void *)(uVar27 * lVar25 * lVar11 +
                               *(long *)((long)&pMVar8->data + lVar17) * uVar12 * lVar11 +
                               *(long *)((long)pMVar8 + lVar17 + -0x40)),pvVar28,lVar25 * _elemsize)
                ;
                pvVar28 = (void *)((long)pvVar28 +
                                  (long)*(int *)((long)pMVar8 + lVar17 + -0x14) * uVar6 * 4);
                uVar7 = uVar7 + 1;
                pMVar8 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                         _M_impl.super__Vector_impl_data._M_start;
                pMVar9 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                         _M_impl.super__Vector_impl_data._M_finish;
                lVar17 = lVar17 + 0x48;
              } while (uVar7 < (ulong)(((long)pMVar9 - (long)pMVar8 >> 3) * -0x71c71c71c71c71c7));
            }
            uVar27 = uVar27 + 1;
            pMVar14 = pMVar9;
          } while (uVar27 != uVar1);
        }
        uVar12 = uVar12 + 1;
      } while (uVar12 != uVar2);
    }
  }
  return 0;
}

Assistant:

int Slice_x86::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;
    const int* slices_ptr = slices;
    int positive_axis = axis < 0 ? dims + axis : axis;

    if (dims == 1) // positive_axis == 0
    {
        // slice vector
        int w = bottom_blob.w * elempack;
        int q = 0;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            int slice = slices_ptr[i];
            if (slice == -233)
            {
                slice = (w - q) / (top_blobs.size() - i);
            }

            int out_elempack = 1;
#if __SSE2__
            if (opt.use_packing_layout)
            {
#if __AVX__
                out_elempack = slice % 8 == 0 ? 8 : slice % 4 == 0 ? 4 : 1;
#else
                out_elempack = slice % 4 == 0 ? 4 : 1;
#endif
            }
#endif // __SSE2__
            size_t out_elemsize = elemsize / elempack * out_elempack;

            Mat& top_blob = top_blobs[i];
            top_blob.create(slice / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            const float* ptr = (const float*)bottom_blob + q;
            float* outptr = top_blob;
            memcpy(outptr, ptr, top_blob.w * top_blob.elemsize);

            q += slice;
        }
    }

    if (dims == 2 && positive_axis == 0)
    {
        // slice image height
        int w = bottom_blob.w;
        int h = bottom_blob.h * elempack;

        int q = 0;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            int slice = slices_ptr[i];
            if (slice == -233)
            {
                slice = (h - q) / (top_blobs.size() - i);
            }

            int out_elempack = 1;
#if __SSE2__
            if (opt.use_packing_layout)
            {
#if __AVX__
                out_elempack = slice % 8 == 0 ? 8 : slice % 4 == 0 ? 4 : 1;
#else
                out_elempack = slice % 4 == 0 ? 4 : 1;
#endif
            }
#endif // __SSE2__
            size_t out_elemsize = elemsize / elempack * out_elempack;

            Mat& top_blob = top_blobs[i];
            top_blob.create(w, slice / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            q += slice;
        }

        size_t out_elemsize = top_blobs[0].elemsize;
        int out_elempack = top_blobs[0].elempack;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            out_elemsize = std::min(out_elemsize, top_blobs[i].elemsize);
            out_elempack = std::min(out_elempack, top_blobs[i].elempack);
        }

        Mat bottom_blob_unpacked = bottom_blob;
        if (elempack > out_elempack)
        {
            convert_packing(bottom_blob, bottom_blob_unpacked, out_elempack, opt);
        }

        const float* ptr = bottom_blob_unpacked;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            Mat& top_blob = top_blobs[i];

#if __SSE2__
#if __AVX__
            if (out_elempack == 4 && top_blob.elempack == 8)
            {
                for (int j = 0; j < top_blob.h; j++)
                {
                    const float* r0 = ptr;
                    const float* r1 = ptr + w * 4;

                    float* outptr0 = top_blob.row(j);

                    for (int j = 0; j < w; j++)
                    {
                        outptr0[0] = r0[0];
                        outptr0[1] = r0[1];
                        outptr0[2] = r0[2];
                        outptr0[3] = r0[3];
                        outptr0[4] = r1[0];
                        outptr0[5] = r1[1];
                        outptr0[6] = r1[2];
                        outptr0[7] = r1[3];

                        r0 += 4;
                        r1 += 4;
                        outptr0 += 8;
                    }

                    ptr += w * 8;
                }
            }
            if (out_elempack == 1 && top_blob.elempack == 8)
            {
                for (int j = 0; j < top_blob.h; j++)
                {
                    const float* r0 = ptr;
                    const float* r1 = ptr + w;
                    const float* r2 = ptr + w * 2;
                    const float* r3 = ptr + w * 3;
                    const float* r4 = ptr + w * 4;
                    const float* r5 = ptr + w * 5;
                    const float* r6 = ptr + w * 6;
                    const float* r7 = ptr + w * 7;

                    float* outptr0 = top_blob.row(j);

                    for (int j = 0; j < w; j++)
                    {
                        outptr0[0] = *r0++;
                        outptr0[1] = *r1++;
                        outptr0[2] = *r2++;
                        outptr0[3] = *r3++;
                        outptr0[4] = *r4++;
                        outptr0[5] = *r5++;
                        outptr0[6] = *r6++;
                        outptr0[7] = *r7++;

                        outptr0 += 8;
                    }

                    ptr += w * 8;
                }
            }
#endif // __AVX__
            if (out_elempack == 1 && top_blob.elempack == 4)
            {
                for (int j = 0; j < top_blob.h; j++)
                {
                    const float* r0 = ptr;
                    const float* r1 = ptr + w;
                    const float* r2 = ptr + w * 2;
                    const float* r3 = ptr + w * 3;

                    float* outptr0 = top_blob.row(j);

                    for (int j = 0; j < w; j++)
                    {
                        outptr0[0] = *r0++;
                        outptr0[1] = *r1++;
                        outptr0[2] = *r2++;
                        outptr0[3] = *r3++;

                        outptr0 += 4;
                    }

                    ptr += w * 4;
                }
            }
#endif // __SSE2__
            if (out_elempack == top_blob.elempack)
            {
                // 1-1 4-4 8-8
                int size = w * top_blob.h;

                float* outptr = top_blob;
                memcpy(outptr, ptr, size * top_blob.elemsize);

                ptr += size * top_blob.elempack;
            }
        }
    }

    if (dims == 2 && positive_axis == 1)
    {
        // slice image width
        int w = bottom_blob.w;
        int h = bottom_blob.h;

        int q = 0;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            int slice = slices_ptr[i];
            if (slice == -233)
            {
                slice = (w - q) / (top_blobs.size() - i);
            }

            Mat& top_blob = top_blobs[i];
            top_blob.create(slice, h, elemsize, elempack, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            q += slice;
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int j = 0; j < h; j++)
        {
            const float* ptr = bottom_blob.row<const float>(j);
            for (size_t i = 0; i < top_blobs.size(); i++)
            {
                Mat& top_blob = top_blobs[i];

                float* outptr = top_blob.row(j);
                memcpy(outptr, ptr, top_blob.w * elemsize);

                ptr += top_blob.w * elempack;
            }
        }
    }

    if (dims == 3 && positive_axis == 0)
    {
        // slice dim channel
        int w = bottom_blob.w;
        int h = bottom_blob.h;
        int channels = bottom_blob.c * elempack;

        int q = 0;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            int slice = slices_ptr[i];
            if (slice == -233)
            {
                slice = (channels - q) / (top_blobs.size() - i);
            }

            int out_elempack = 1;
#if __SSE2__
            if (opt.use_packing_layout)
            {
#if __AVX__
                out_elempack = slice % 8 == 0 ? 8 : slice % 4 == 0 ? 4 : 1;
#else
                out_elempack = slice % 4 == 0 ? 4 : 1;
#endif
            }
#endif // __SSE2__
            size_t out_elemsize = elemsize / elempack * out_elempack;

            Mat& top_blob = top_blobs[i];
            top_blob.create(w, h, slice / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            q += slice;
        }

        size_t out_elemsize = top_blobs[0].elemsize;
        int out_elempack = top_blobs[0].elempack;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            out_elemsize = std::min(out_elemsize, top_blobs[i].elemsize);
            out_elempack = std::min(out_elempack, top_blobs[i].elempack);
        }

        Mat bottom_blob_unpacked = bottom_blob;
        if (elempack > out_elempack)
        {
            convert_packing(bottom_blob, bottom_blob_unpacked, out_elempack, opt);
        }

        int p = 0;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            Mat& top_blob = top_blobs[i];

#if __SSE2__
#if __AVX__
            if (out_elempack == 4 && top_blob.elempack == 8)
            {
                int size = top_blob.w * top_blob.h;

                for (int q = 0; q < top_blob.c; q++)
                {
                    const float* r0 = bottom_blob_unpacked.channel(p);
                    const float* r1 = bottom_blob_unpacked.channel(p + 1);

                    float* outptr0 = top_blob.channel(q);

                    for (int j = 0; j < size; j++)
                    {
                        outptr0[0] = r0[0];
                        outptr0[1] = r0[1];
                        outptr0[2] = r0[2];
                        outptr0[3] = r0[3];
                        outptr0[4] = r1[0];
                        outptr0[5] = r1[1];
                        outptr0[6] = r1[2];
                        outptr0[7] = r1[3];

                        r0 += 4;
                        r1 += 4;
                        outptr0 += 8;
                    }

                    p += 2;
                }
            }
            if (out_elempack == 1 && top_blob.elempack == 8)
            {
                int size = top_blob.w * top_blob.h;

                for (int q = 0; q < top_blob.c; q++)
                {
                    const float* r0 = bottom_blob_unpacked.channel(p);
                    const float* r1 = bottom_blob_unpacked.channel(p + 1);
                    const float* r2 = bottom_blob_unpacked.channel(p + 2);
                    const float* r3 = bottom_blob_unpacked.channel(p + 3);
                    const float* r4 = bottom_blob_unpacked.channel(p + 4);
                    const float* r5 = bottom_blob_unpacked.channel(p + 5);
                    const float* r6 = bottom_blob_unpacked.channel(p + 6);
                    const float* r7 = bottom_blob_unpacked.channel(p + 7);

                    float* outptr0 = top_blob.channel(q);

                    for (int j = 0; j < size; j++)
                    {
                        outptr0[0] = *r0++;
                        outptr0[1] = *r1++;
                        outptr0[2] = *r2++;
                        outptr0[3] = *r3++;
                        outptr0[4] = *r4++;
                        outptr0[5] = *r5++;
                        outptr0[6] = *r6++;
                        outptr0[7] = *r7++;

                        outptr0 += 8;
                    }

                    p += 8;
                }
            }
#endif // __AVX__
            if (out_elempack == 1 && top_blob.elempack == 4)
            {
                int size = top_blob.w * top_blob.h;

                for (int q = 0; q < top_blob.c; q++)
                {
                    const float* r0 = bottom_blob_unpacked.channel(p);
                    const float* r1 = bottom_blob_unpacked.channel(p + 1);
                    const float* r2 = bottom_blob_unpacked.channel(p + 2);
                    const float* r3 = bottom_blob_unpacked.channel(p + 3);

                    float* outptr0 = top_blob.channel(q);

                    for (int j = 0; j < size; j++)
                    {
                        outptr0[0] = *r0++;
                        outptr0[1] = *r1++;
                        outptr0[2] = *r2++;
                        outptr0[3] = *r3++;

                        outptr0 += 4;
                    }

                    p += 4;
                }
            }
#endif // __SSE2__
            if (out_elempack == top_blob.elempack)
            {
                // 1-1 4-4 8-8
                int size = top_blob.total();

                const float* ptr = bottom_blob_unpacked.channel(p);
                float* outptr = top_blob;
                memcpy(outptr, ptr, size * top_blob.elemsize);

                p += top_blob.c;
            }
        }
    }

    if (dims == 3 && positive_axis == 1)
    {
        // slice dim height
        int w = bottom_blob.w;
        int h = bottom_blob.h;
        int channels = bottom_blob.c;

        int q = 0;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            int slice = slices_ptr[i];
            if (slice == -233)
            {
                slice = (h - q) / (top_blobs.size() - i);
            }

            Mat& top_blob = top_blobs[i];
            top_blob.create(w, slice, channels, elemsize, elempack, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            q += slice;
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int p = 0; p < channels; p++)
        {
            const float* ptr = bottom_blob.channel(p);

            for (size_t i = 0; i < top_blobs.size(); i++)
            {
                Mat& top_blob = top_blobs[i];

                int size = top_blob.w * top_blob.h;

                float* outptr = top_blob.channel(p);
                memcpy(outptr, ptr, size * elemsize);

                ptr += size * elempack;
            }
        }
    }

    if (dims == 3 && positive_axis == 2)
    {
        // slice dim width
        int w = bottom_blob.w;
        int h = bottom_blob.h;
        int channels = bottom_blob.c;

        int q = 0;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            int slice = slices_ptr[i];
            if (slice == -233)
            {
                slice = (w - q) / (top_blobs.size() - i);
            }

            Mat& top_blob = top_blobs[i];
            top_blob.create(slice, h, channels, elemsize, elempack, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            q += slice;
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int p = 0; p < channels; p++)
        {
            const float* ptr = bottom_blob.channel(p);

            for (int j = 0; j < h; j++)
            {
                for (size_t i = 0; i < top_blobs.size(); i++)
                {
                    Mat& top_blob = top_blobs[i];

                    float* outptr = top_blob.channel(p).row(j);
                    memcpy(outptr, ptr, top_blob.w * elemsize);

                    ptr += top_blob.w * elempack;
                }
            }
        }
    }

    return 0;
}